

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

uint aom_avg_4x4_sse2(uint8_t *s,int p)

{
  int in_ESI;
  void *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint avg;
  __m128i u0;
  __m128i s1;
  __m128i s0;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined2 local_88;
  undefined2 uStack_86;
  undefined2 local_78;
  undefined2 uStack_76;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 local_18;
  undefined4 uStack_14;
  
  xx_loadl_32(in_RDI);
  xx_loadl_32((void *)((long)in_RDI + (long)in_ESI));
  local_18 = (undefined4)extraout_XMM0_Qa;
  uStack_14 = (undefined4)((ulong)extraout_XMM0_Qa >> 0x20);
  local_28 = (undefined4)extraout_XMM0_Qa_00;
  uStack_24 = (undefined4)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  local_f8 = CONCAT44(local_28,local_18);
  uStack_f0._0_4_ = uStack_14;
  uStack_f0._4_4_ = uStack_24;
  xx_loadl_32((void *)((long)in_RDI + (long)(in_ESI * 2)));
  xx_loadl_32((void *)((long)in_RDI + (long)(in_ESI * 3)));
  local_38 = (undefined4)extraout_XMM0_Qa_01;
  uStack_34 = (undefined4)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  local_48 = (undefined4)extraout_XMM0_Qa_02;
  uStack_44 = (undefined4)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  local_108 = CONCAT44(local_48,local_38);
  uStack_100._0_4_ = uStack_34;
  uStack_100._4_4_ = uStack_44;
  auVar1._8_8_ = uStack_f0;
  auVar1._0_8_ = local_f8;
  auVar1 = psadbw(auVar1,ZEXT816(0));
  auVar2._8_8_ = uStack_100;
  auVar2._0_8_ = local_108;
  auVar2 = psadbw(auVar2,ZEXT816(0));
  local_78 = auVar1._0_2_;
  uStack_76 = auVar1._2_2_;
  local_88 = auVar2._0_2_;
  uStack_86 = auVar2._2_2_;
  local_f8._0_4_ = CONCAT22(uStack_76 + uStack_86,local_78 + local_88);
  return (int)local_f8 + 8U >> 4;
}

Assistant:

unsigned int aom_avg_4x4_sse2(const uint8_t *s, int p) {
  __m128i s0, s1, u0;
  unsigned int avg = 0;
  u0 = _mm_setzero_si128();
  s0 = _mm_unpacklo_epi32(xx_loadl_32(s), xx_loadl_32(s + p));
  s1 = _mm_unpacklo_epi32(xx_loadl_32(s + p * 2), xx_loadl_32(s + p * 3));
  s0 = _mm_sad_epu8(s0, u0);
  s1 = _mm_sad_epu8(s1, u0);
  s0 = _mm_add_epi16(s0, s1);
  avg = _mm_cvtsi128_si32(s0);
  return (avg + 8) >> 4;
}